

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

timestamp_t __thiscall lsim::Simulator::pin_last_change_time(Simulator *this,pin_t pin)

{
  size_type sVar1;
  const_reference pvVar2;
  timestamp_t tVar3;
  value_type node_id;
  pin_t pin_local;
  Simulator *this_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pin_nodes);
  if (pin < sVar1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_pin_nodes,(ulong)pin);
    tVar3 = node_last_change_time(this,*pvVar2);
    return tVar3;
  }
  __assert_fail("pin < m_pin_nodes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0x72,"timestamp_t lsim::Simulator::pin_last_change_time(pin_t) const");
}

Assistant:

timestamp_t Simulator::pin_last_change_time(pin_t pin) const {
    assert(pin < m_pin_nodes.size());

    auto node_id = m_pin_nodes[pin];
    return node_last_change_time(node_id);
}